

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildBrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  ushort uVar1;
  ushort uVar2;
  short *psVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint functionId;
  undefined4 *puVar7;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,newOpcode) != 0xe6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1b09,"(newOpcode == Js::OpCode::BrOnEmpty)",
                       "newOpcode == Js::OpCode::BrOnEmpty");
    if (!bVar5) goto LAB_004e4207;
    *puVar7 = 0;
  }
  bVar5 = OpCodeAttr::IsProfiledOp(newOpcode);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1b0b,"(!OpCodeAttr::IsProfiledOp(newOpcode))",
                       "!OpCodeAttr::IsProfiledOp(newOpcode)");
    if (!bVar5) goto LAB_004e4207;
    *puVar7 = 0;
  }
  bVar5 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1b0c,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar5) goto LAB_004e4207;
    *puVar7 = 0;
  }
  psVar3 = (short *)(this->m_jnReader).m_currentLocation;
  (this->m_jnReader).m_currentLocation = (byte *)(psVar3 + 3);
  if ((this->m_jnReader).m_endLocation < psVar3 + 3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/ByteCode/ByteCodeReader.h"
                       ,0x68,"(m_currentLocation <= m_endLocation)",
                       "m_currentLocation <= m_endLocation");
    if (!bVar5) {
LAB_004e4207:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar6 = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,ClosureRegCheckPhase,uVar6,functionId);
  if (!bVar5) {
    DoClosureRegCheck(this,(uint)(ushort)psVar3[1]);
  }
  uVar1 = psVar3[1];
  uVar2 = psVar3[2];
  uVar6 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  BuildBrBReturn(this,newOpcode,offset,(uint)uVar1,(uint)uVar2,(int)*psVar3 + uVar6);
  return;
}

Assistant:

void
IRBuilder::BuildBrReg1Unsigned1(Js::OpCode newOpcode, uint32 offset)
{
    Assert(newOpcode == Js::OpCode::BrOnEmpty
        /* || newOpcode == Js::OpCode::BrOnNotEmpty */     // BrOnNotEmpty not generate by the byte code
    );

    Assert(!OpCodeAttr::IsProfiledOp(newOpcode));
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    auto layout = m_jnReader.GetLayout<Js::OpLayoutT_BrReg1Unsigned1<SizePolicy>>();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(layout->R1);
    }

    BuildBrBReturn(newOpcode, offset, layout->R1, layout->C2, m_jnReader.GetCurrentOffset() + layout->RelativeJumpOffset);
}